

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

CollSeq * sqlite3LocateCollSeq(Parse *pParse,char *zName)

{
  u8 enc_00;
  byte bVar1;
  sqlite3 *db_00;
  CollSeq *local_30;
  CollSeq *pColl;
  u8 initbusy;
  u8 enc;
  sqlite3 *db;
  char *zName_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  enc_00 = db_00->enc;
  bVar1 = (db_00->init).busy;
  local_30 = sqlite3FindCollSeq(db_00,enc_00,zName,(uint)bVar1);
  if ((bVar1 == 0) &&
     ((local_30 == (CollSeq *)0x0 ||
      (local_30->xCmp == (_func_int_void_ptr_int_void_ptr_int_void_ptr *)0x0)))) {
    local_30 = sqlite3GetCollSeq(pParse,enc_00,local_30,zName);
  }
  return local_30;
}

Assistant:

SQLITE_PRIVATE CollSeq *sqlite3LocateCollSeq(Parse *pParse, const char *zName){
  sqlite3 *db = pParse->db;
  u8 enc = ENC(db);
  u8 initbusy = db->init.busy;
  CollSeq *pColl;

  pColl = sqlite3FindCollSeq(db, enc, zName, initbusy);
  if( !initbusy && (!pColl || !pColl->xCmp) ){
    pColl = sqlite3GetCollSeq(pParse, enc, pColl, zName);
  }

  return pColl;
}